

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

bool google::protobuf::compiler::java::anon_unknown_6::IsRepeatedFieldConflicting
               (FieldDescriptor *field1,string_view name1,FieldDescriptor *field2,string_view name2,
               string *info)

{
  string_view name2_00;
  string_view name1_00;
  string_view name1_01;
  bool bVar1;
  string_view sVar2;
  char (*in_stack_fffffffffffffcf8) [9];
  AlphaNum local_2f8;
  AlphaNum local_2c8;
  AlphaNum local_298;
  string_view local_268;
  AlphaNum local_258;
  AlphaNum local_228;
  string local_1f8;
  FieldDescriptor *local_1d8;
  size_t local_1d0;
  string_view local_1c8;
  char *local_1b8;
  char *local_1b0;
  string_view local_1a8;
  AlphaNum local_198;
  AlphaNum local_168;
  AlphaNum local_138;
  string_view local_108;
  AlphaNum local_f8;
  AlphaNum local_c8;
  string local_98;
  FieldDescriptor *local_78;
  size_t local_70;
  string_view local_68;
  char *local_58;
  char *local_50;
  FieldDescriptor *local_48;
  FieldDescriptor *field2_local;
  FieldDescriptor *field1_local;
  string_view name2_local;
  string_view name1_local;
  
  name2_local._M_len = (size_t)name2._M_str;
  field1_local = (FieldDescriptor *)name2._M_len;
  name2_local._M_str = (char *)name1._M_len;
  local_48 = field2;
  field2_local = field1;
  bVar1 = FieldDescriptor::is_repeated(field1);
  if ((bVar1) && (bVar1 = FieldDescriptor::is_repeated(local_48), !bVar1)) {
    local_58 = name2_local._M_str;
    local_50 = name1._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"Count");
    local_78 = field1_local;
    local_70 = name2_local._M_len;
    name1_01._M_str = local_50;
    name1_01._M_len = (size_t)local_58;
    sVar2._M_str = (char *)name2_local._M_len;
    sVar2._M_len = (size_t)field1_local;
    bVar1 = EqualWithSuffix(name1_01,local_68,sVar2);
    if (bVar1) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_c8,"both repeated field \"");
      local_108 = FieldDescriptor::name(field2_local);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_f8,local_108);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_138,"\" and singular ");
      absl::lts_20250127::AlphaNum::AlphaNum(&local_168,"field \"");
      local_1a8 = FieldDescriptor::name(local_48);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_198,local_1a8);
      absl::lts_20250127::
      StrCat<char[24],char[4],std::basic_string_view<char,std::char_traits<char>>,char[9]>
                (&local_98,(lts_20250127 *)&local_c8,&local_f8,&local_138,&local_168,&local_198,
                 (AlphaNum *)"\" generate the method \"",(char (*) [24])0x200bd09,
                 (char (*) [4])&name2_local._M_str,
                 (basic_string_view<char,_std::char_traits<char>_> *)"Count()\"",
                 in_stack_fffffffffffffcf8);
      std::__cxx11::string::operator=((string *)info,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      return true;
    }
    local_1b8 = name2_local._M_str;
    local_1b0 = name1._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"List");
    local_1d8 = field1_local;
    local_1d0 = name2_local._M_len;
    name1_00._M_str = local_1b0;
    name1_00._M_len = (size_t)local_1b8;
    name2_00._M_str = (char *)name2_local._M_len;
    name2_00._M_len = (size_t)field1_local;
    bVar1 = EqualWithSuffix(name1_00,local_1c8,name2_00);
    if (bVar1) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_228,"both repeated field \"");
      local_268 = FieldDescriptor::name(field2_local);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_258,local_268);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_298,"\" and singular ");
      absl::lts_20250127::AlphaNum::AlphaNum(&local_2c8,"field \"");
      sVar2 = FieldDescriptor::name(local_48);
      sVar2._M_len = (char (*) [8])sVar2._M_len;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_2f8,sVar2);
      absl::lts_20250127::
      StrCat<char[24],char[4],std::basic_string_view<char,std::char_traits<char>>,char[8]>
                (&local_1f8,(lts_20250127 *)&local_228,&local_258,&local_298,&local_2c8,&local_2f8,
                 (AlphaNum *)"\" generate the method \"",(char (*) [24])0x200bd09,
                 (char (*) [4])&name2_local._M_str,
                 (basic_string_view<char,_std::char_traits<char>_> *)"List()\"",sVar2._M_len);
      std::__cxx11::string::operator=((string *)info,(string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      return true;
    }
  }
  return false;
}

Assistant:

bool IsRepeatedFieldConflicting(const FieldDescriptor* field1,
                                absl::string_view name1,
                                const FieldDescriptor* field2,
                                absl::string_view name2, std::string* info) {
  if (field1->is_repeated() && !field2->is_repeated()) {
    if (EqualWithSuffix(name1, "Count", name2)) {
      *info =
          absl::StrCat("both repeated field \"", field1->name(),
                       "\" and singular ", "field \"", field2->name(),
                       "\" generate the method \"", "get", name1, "Count()\"");
      return true;
    }
    if (EqualWithSuffix(name1, "List", name2)) {
      *info =
          absl::StrCat("both repeated field \"", field1->name(),
                       "\" and singular ", "field \"", field2->name(),
                       "\" generate the method \"", "get", name1, "List()\"");
      return true;
    }
  }

  return false;
}